

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

basic_value<toml::type_config> * __thiscall
toml::basic_value<toml::type_config>::operator=
          (basic_value<toml::type_config> *this,basic_value<toml::type_config> *v)

{
  anon_union_64_11_c2653db1_for_basic_value<toml::type_config>_2 *paVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 *puVar6;
  undefined1 *puVar7;
  pointer pbVar8;
  value_type_conflict4 vVar9;
  size_type sVar10;
  undefined8 uVar11;
  uint8_t uVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  if (this != v) {
    cleanup(this,(EVP_PKEY_CTX *)v);
    this->type_ = v->type_;
    detail::region::operator=(&this->region_,&v->region_);
    local_28.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->comments_).comments.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar8 = (v->comments_).comments.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_28.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->comments_).comments.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_28.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->comments_).comments.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->comments_).comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (v->comments_).comments.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->comments_).comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
    (this->comments_).comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (v->comments_).comments.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (v->comments_).comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (v->comments_).comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (v->comments_).comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_28);
    paVar1 = &this->field_1;
    switch(this->type_) {
    case boolean:
      paVar1->boolean_ = (v->field_1).boolean_;
      break;
    case integer:
      (this->field_1).integer_.value = (v->field_1).integer_.value;
      sVar10 = (v->field_1).string_.value.field_2._M_allocated_capacity;
      (this->field_1).string_.value._M_string_length = (v->field_1).string_.value._M_string_length;
      (this->field_1).string_.value.field_2._M_allocated_capacity = sVar10;
      *(undefined8 *)((long)&(this->field_1).string_.value.field_2 + 8) =
           *(undefined8 *)((long)&(v->field_1).string_.value.field_2 + 8);
      puVar2 = (undefined8 *)((long)&this->field_1 + 0x30);
      *(undefined8 **)((long)&this->field_1 + 0x20) = puVar2;
      puVar6 = *(undefined8 **)((long)&v->field_1 + 0x20);
      puVar3 = (undefined8 *)((long)&v->field_1 + 0x30);
      if (puVar6 == puVar3) {
        uVar11 = *(undefined8 *)((long)&v->field_1 + 0x38);
        *puVar2 = *puVar3;
        *(undefined8 *)((long)&this->field_1 + 0x38) = uVar11;
      }
      else {
        *(undefined8 **)((long)&this->field_1 + 0x20) = puVar6;
        *(undefined8 *)((long)&this->field_1 + 0x30) = *puVar3;
      }
      *(undefined8 *)((long)&this->field_1 + 0x28) = *(undefined8 *)((long)&v->field_1 + 0x28);
      *(undefined8 **)((long)&v->field_1 + 0x20) = puVar3;
      *(undefined8 *)((long)&v->field_1 + 0x28) = 0;
      (v->field_1).integer_.format.suffix.field_2._M_local_buf[0] = '\0';
      break;
    case floating:
      (this->field_1).integer_.value = (v->field_1).integer_.value;
      sVar10 = (v->field_1).string_.value.field_2._M_allocated_capacity;
      (this->field_1).string_.value._M_string_length = (v->field_1).string_.value._M_string_length;
      (this->field_1).string_.value.field_2._M_allocated_capacity = sVar10;
      puVar2 = (undefined8 *)((long)&this->field_1 + 0x28);
      *(undefined8 **)((long)&this->field_1 + 0x18) = puVar2;
      puVar6 = *(undefined8 **)((long)&(v->field_1).string_.value.field_2 + 8);
      puVar3 = (undefined8 *)((long)&v->field_1 + 0x28);
      if (puVar6 == puVar3) {
        uVar11 = *(undefined8 *)((long)&v->field_1 + 0x30);
        *puVar2 = *puVar3;
        *(undefined8 *)((long)&this->field_1 + 0x30) = uVar11;
      }
      else {
        *(undefined8 **)((long)&(this->field_1).string_.value.field_2 + 8) = puVar6;
        *(undefined8 *)((long)&this->field_1 + 0x28) = *puVar3;
      }
      *(undefined8 *)((long)&this->field_1 + 0x20) = *(undefined8 *)((long)&v->field_1 + 0x20);
      *(undefined8 **)((long)&v->field_1 + 0x18) = puVar3;
      *(undefined8 *)((long)&v->field_1 + 0x20) = 0;
      *(undefined1 *)&(v->field_1).integer_.format.suffix._M_string_length = 0;
      break;
    case string:
      paVar4 = &(this->field_1).string_.value.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&this->field_1 = paVar4;
      puVar7 = (undefined1 *)(v->field_1).integer_.value;
      paVar5 = &(v->field_1).string_.value.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7 == paVar5) {
        uVar11 = *(undefined8 *)((long)&(v->field_1).string_.value.field_2 + 8);
        paVar4->_M_allocated_capacity = paVar5->_M_allocated_capacity;
        *(undefined8 *)((long)&(this->field_1).string_.value.field_2 + 8) = uVar11;
      }
      else {
        (paVar1->integer_).value = (value_type_conflict4)puVar7;
        paVar4->_M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      (this->field_1).string_.value._M_string_length = (v->field_1).string_.value._M_string_length;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&v->field_1 = paVar5;
      (v->field_1).string_.value._M_string_length = 0;
      *(undefined1 *)&(v->field_1).integer_.format.width = 0;
      (this->field_1).string_.format = (v->field_1).string_.format;
      break;
    case offset_datetime:
    case local_datetime:
    case local_time:
      vVar9 = (v->field_1).integer_.value;
      sVar10 = (v->field_1).string_.value._M_string_length;
      uVar11 = *(undefined8 *)((long)&(v->field_1).string_.value.field_2 + 8);
      (this->field_1).string_.value.field_2._M_allocated_capacity =
           (v->field_1).string_.value.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(this->field_1).string_.value.field_2 + 8) = uVar11;
      (paVar1->integer_).value = vVar9;
      (this->field_1).string_.value._M_string_length = sVar10;
      break;
    case local_date:
      uVar12 = *(uint8_t *)((long)&v->field_1 + 5);
      *(uint8_t *)((long)&this->field_1 + 4) = *(uint8_t *)((long)&v->field_1 + 4);
      *(uint8_t *)((long)&this->field_1 + 5) = uVar12;
      (paVar1->offset_datetime_).value.date = (v->field_1).offset_datetime_.value.date;
      break;
    case array:
      (this->field_1).integer_.value = (v->field_1).integer_.value;
      (v->field_1).integer_.value = 0;
      *(undefined4 *)((long)&this->field_1 + 0x10) = *(undefined4 *)((long)&v->field_1 + 0x10);
      (this->field_1).string_.value._M_string_length = (v->field_1).string_.value._M_string_length;
      break;
    case table:
      (this->field_1).integer_.value = (v->field_1).integer_.value;
      (v->field_1).integer_.value = 0;
      sVar10 = (v->field_1).string_.value.field_2._M_allocated_capacity;
      (this->field_1).string_.value._M_string_length = (v->field_1).string_.value._M_string_length;
      (this->field_1).string_.value.field_2._M_allocated_capacity = sVar10;
      break;
    default:
      paVar1->empty_ = '\0';
    }
  }
  return this;
}

Assistant:

basic_value& operator=(basic_value&& v)
    {
        if(this == std::addressof(v)) {return *this;}

        this->cleanup();
        this->type_     = v.type_;
        this->region_   = std::move(v.region_);
        this->comments_ = std::move(v.comments_);
        switch(this->type_)
        {
            case value_t::boolean        : assigner(boolean_        , std::move(v.boolean_        )); break;
            case value_t::integer        : assigner(integer_        , std::move(v.integer_        )); break;
            case value_t::floating       : assigner(floating_       , std::move(v.floating_       )); break;
            case value_t::string         : assigner(string_         , std::move(v.string_         )); break;
            case value_t::offset_datetime: assigner(offset_datetime_, std::move(v.offset_datetime_)); break;
            case value_t::local_datetime : assigner(local_datetime_ , std::move(v.local_datetime_ )); break;
            case value_t::local_date     : assigner(local_date_     , std::move(v.local_date_     )); break;
            case value_t::local_time     : assigner(local_time_     , std::move(v.local_time_     )); break;
            case value_t::array          : assigner(array_          , std::move(v.array_          )); break;
            case value_t::table          : assigner(table_          , std::move(v.table_          )); break;
            default                      : assigner(empty_          , '\0'                         ); break;
        }
        return *this;
    }